

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall mpt::slice::slice(slice *this,slice *from)

{
  uintptr_t uVar1;
  
  array::array(&this->super_array,&from->super_array);
  this->_off = 0;
  this->_len = 0;
  reference<mpt::array::content>::operator=
            ((reference<mpt::array::content> *)this,(reference<mpt::array::content> *)from);
  if ((this->super_array)._buf._ref != (content *)0x0) {
    uVar1 = from->_len;
    this->_off = from->_off;
    this->_len = uVar1;
  }
  return;
}

Assistant:

slice::slice(slice const& from) : array(from), _off(0), _len(0)
{
	_buf = from._buf;
	if (!_buf.instance()) {
		return;
	}
	_len = from._len;
	_off = from._off;
}